

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::set<dgrminer::children_candidate,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>,std::set<dgrminer::children_candidate,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
          *lhs,set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
               *rhs)

{
  bool bVar1;
  AssertionResult AVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  if ((lhs->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
      (rhs->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar1 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<dgrminer::children_candidate>,std::_Rb_tree_const_iterator<dgrminer::children_candidate>>
                      ((lhs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<dgrminer::children_candidate>)
                       &(lhs->_M_t)._M_impl.super__Rb_tree_header,
                       (rhs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
    if (bVar1) {
      AVar3 = AssertionSuccess();
      sVar2 = AVar3.message_.ptr_;
      goto LAB_0011642f;
    }
  }
  AVar3 = CmpHelperEQFailure<std::set<dgrminer::children_candidate,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>,std::set<dgrminer::children_candidate,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>>
                    (this,lhs_expression,rhs_expression,lhs,rhs);
  sVar2 = AVar3.message_.ptr_;
LAB_0011642f:
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}